

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O1

void reportIpmNoProgress(HighsOptions *options,Info *ipx_info)

{
  HighsLogOptions *log_options_;
  
  log_options_ = &(options->super_HighsOptionsStruct).log_options;
  highsLogUser(log_options_,kWarning,"No progress: primal objective value       = %11.4g\n",
               (ipx_info->super_ipx_info).pobjval);
  highsLogUser(log_options_,kWarning,"No progress: max absolute primal residual = %11.4g\n",
               (ipx_info->super_ipx_info).abs_presidual);
  highsLogUser(log_options_,kWarning,"No progress: max absolute   dual residual = %11.4g\n",
               (ipx_info->super_ipx_info).abs_dresidual);
  return;
}

Assistant:

void reportIpmNoProgress(const HighsOptions& options,
                         const ipx::Info& ipx_info) {
  highsLogUser(options.log_options, HighsLogType::kWarning,
               "No progress: primal objective value       = %11.4g\n",
               ipx_info.pobjval);
  highsLogUser(options.log_options, HighsLogType::kWarning,
               "No progress: max absolute primal residual = %11.4g\n",
               ipx_info.abs_presidual);
  highsLogUser(options.log_options, HighsLogType::kWarning,
               "No progress: max absolute   dual residual = %11.4g\n",
               ipx_info.abs_dresidual);
}